

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum4096.c
# Opt level: O0

_Bool Hacl_Bignum4096_mod_exp_vartime
                (uint64_t *n,uint64_t *a,uint32_t bBits,uint64_t *b,uint64_t *res)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint32_t nBits;
  uint64_t is_valid_m;
  uint64_t *res_local;
  uint64_t *b_local;
  uint32_t bBits_local;
  uint64_t *a_local;
  uint64_t *n_local;
  
  uVar1 = exp_check(n,a,bBits,b);
  uVar2 = Hacl_Bignum_Lib_bn_get_top_index_u64(0x40,n);
  if (uVar1 == 0xffffffffffffffff) {
    exp_vartime((int)uVar2 << 6,n,a,bBits,b,res);
  }
  else {
    memset(res,0,0x200);
  }
  return uVar1 == 0xffffffffffffffff;
}

Assistant:

bool
Hacl_Bignum4096_mod_exp_vartime(
  uint64_t *n,
  uint64_t *a,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *res
)
{
  uint64_t is_valid_m = exp_check(n, a, bBits, b);
  uint32_t nBits = 64U * (uint32_t)Hacl_Bignum_Lib_bn_get_top_index_u64(64U, n);
  if (is_valid_m == 0xFFFFFFFFFFFFFFFFULL)
  {
    exp_vartime(nBits, n, a, bBits, b, res);
  }
  else
  {
    memset(res, 0U, 64U * sizeof (uint64_t));
  }
  return is_valid_m == 0xFFFFFFFFFFFFFFFFULL;
}